

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O0

void __thiscall OpenMD::XYZVisitor::writeFrame(XYZVisitor *this,ostream *outStream)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  bool bVar8;
  size_type sVar9;
  void *this_00;
  SnapshotManager *this_01;
  double *pdVar10;
  ostream *poVar11;
  reference pbVar12;
  ostream *in_RSI;
  long in_RDI;
  RealType RVar13;
  Mat3x3d box;
  Snapshot *currSnapshot;
  char buffer [1024];
  iterator i;
  Snapshot *in_stack_fffffffffffffaa8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__lhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffac0;
  RectMatrix<double,_3U,_3U> local_468;
  Snapshot *local_420;
  char local_418 [1024];
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_18;
  ostream *local_10;
  
  local_10 = in_RSI;
  __gnu_cxx::
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::__normal_iterator(&local_18);
  bVar8 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(in_stack_fffffffffffffac0);
  if (bVar8) {
    poVar11 = std::operator<<((ostream *)&std::cerr,"Current Frame does not contain any atoms");
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
  }
  poVar11 = local_10;
  sVar9 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI + 0x648));
  this_00 = (void *)std::ostream::operator<<(poVar11,sVar9);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  this_01 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 0x28));
  local_420 = SnapshotManager::getCurrentSnapshot(this_01);
  Snapshot::getHmat(in_stack_fffffffffffffaa8);
  RVar13 = Snapshot::getTime(local_420);
  pdVar10 = RectMatrix<double,_3U,_3U>::operator()(&local_468,0,0);
  dVar1 = *pdVar10;
  pdVar10 = RectMatrix<double,_3U,_3U>::operator()(&local_468,0,1);
  dVar2 = *pdVar10;
  pdVar10 = RectMatrix<double,_3U,_3U>::operator()(&local_468,0,2);
  dVar3 = *pdVar10;
  pdVar10 = RectMatrix<double,_3U,_3U>::operator()(&local_468,1,0);
  dVar4 = *pdVar10;
  pdVar10 = RectMatrix<double,_3U,_3U>::operator()(&local_468,1,1);
  dVar5 = *pdVar10;
  pdVar10 = RectMatrix<double,_3U,_3U>::operator()(&local_468,1,2);
  dVar6 = *pdVar10;
  pdVar10 = RectMatrix<double,_3U,_3U>::operator()(&local_468,2,0);
  dVar7 = *pdVar10;
  pdVar10 = RectMatrix<double,_3U,_3U>::operator()(&local_468,2,1);
  this_02 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)*pdVar10;
  pdVar10 = RectMatrix<double,_3U,_3U>::operator()(&local_468,2,2);
  __lhs = (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)*pdVar10;
  snprintf(local_418,0x400,"%15.8f;%15.8f%15.8f%15.8f;%15.8f%15.8f%15.8f;%15.8f%15.8f%15.8f",RVar13,
           dVar1,dVar2,dVar3,dVar4,dVar5,dVar6,dVar7);
  poVar11 = std::operator<<(local_10,local_418);
  std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
  local_18._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(this_02);
  while( true ) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end(this_02);
    bVar8 = __gnu_cxx::operator!=
                      (__lhs,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)this_02);
    poVar11 = local_10;
    if (!bVar8) break;
    pbVar12 = __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&local_18);
    poVar11 = std::operator<<(poVar11,(string *)pbVar12);
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_18);
  }
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x34d927);
  return;
}

Assistant:

void XYZVisitor::writeFrame(std::ostream& outStream) {
    std::vector<std::string>::iterator i;
    char buffer[1024];

    if (frame.empty())
      std::cerr << "Current Frame does not contain any atoms" << std::endl;

    // total number of atoms
    outStream << frame.size() << std::endl;

    // write comment line
    Snapshot* currSnapshot = info->getSnapshotManager()->getCurrentSnapshot();
    Mat3x3d box            = currSnapshot->getHmat();

    snprintf(buffer, 1024,
             "%15.8f;%15.8f%15.8f%15.8f;%15.8f%15.8f%15.8f;%15.8f%15.8f%15.8f",
             currSnapshot->getTime(), box(0, 0), box(0, 1), box(0, 2),
             box(1, 0), box(1, 1), box(1, 2), box(2, 0), box(2, 1), box(2, 2));

    outStream << buffer << std::endl;

    for (i = frame.begin(); i != frame.end(); ++i)
      outStream << *i << std::endl;
  }